

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O0

Vec_Int_t * Acec_MultCollectInputs(Vec_Int_t *vPairs,Vec_Int_t *vRanks,int iObj)

{
  int iVar1;
  int Entry;
  Vec_Int_t *p;
  int *pArray;
  int iObj2;
  int iObj1;
  int k;
  Vec_Int_t *vItems;
  int iObj_local;
  Vec_Int_t *vRanks_local;
  Vec_Int_t *vPairs_local;
  
  p = Vec_IntAlloc(100);
  for (iObj2 = 0; iVar1 = Vec_IntSize(vPairs), iObj2 + 1 < iVar1; iObj2 = iObj2 + 2) {
    iVar1 = Vec_IntEntry(vPairs,iObj2);
    Entry = Vec_IntEntry(vPairs,iObj2 + 1);
    if (iObj == iVar1) {
      Vec_IntPushUnique(p,Entry);
    }
    else if (iObj == Entry) {
      Vec_IntPushUnique(p,iVar1);
    }
  }
  pArray = Vec_IntArray(p);
  iVar1 = Vec_IntSize(p);
  Vec_IntSelectSortCost(pArray,iVar1,vRanks);
  return p;
}

Assistant:

Vec_Int_t * Acec_MultCollectInputs( Vec_Int_t * vPairs, Vec_Int_t * vRanks, int iObj )
{
    Vec_Int_t * vItems = Vec_IntAlloc( 100 );
    int k, iObj1, iObj2;
    // collect all those appearing with this one
    Vec_IntForEachEntryDouble( vPairs, iObj1, iObj2, k )
        if ( iObj == iObj1 )
            Vec_IntPushUnique( vItems, iObj2 );
        else if ( iObj == iObj2 )
            Vec_IntPushUnique( vItems, iObj1 );
    // sort items by rank cost
    Vec_IntSelectSortCost( Vec_IntArray(vItems), Vec_IntSize(vItems), vRanks );
    return vItems;
}